

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall Kvm::print(Kvm *this,Value *v,ostream *out)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  char cVar5;
  
  if (((ulong)v & 1) != 0) {
    std::ostream::_M_insert<long>((long)out);
    return;
  }
  if (((ulong)v & 2) == 0) {
    switch(v->type_) {
    case BOOLEAN:
      pcVar3 = "#f";
      if (*(char *)&v[1]._vptr_Value != '\0') {
        pcVar3 = "#t";
      }
      break;
    case STRING:
      std::operator<<(out,"\"");
      pp_Var4 = v[1]._vptr_Value;
      do {
        cVar5 = *(char *)pp_Var4;
        if (cVar5 == '\n') {
          pcVar3 = "\\n";
LAB_0010bb4a:
          std::operator<<(out,pcVar3);
        }
        else {
          if (cVar5 == '\"') {
            pcVar3 = "\\\"";
            goto LAB_0010bb4a;
          }
          if (cVar5 == '\\') {
            pcVar3 = "\\\\";
            goto LAB_0010bb4a;
          }
          if (cVar5 == '\0') goto LAB_0010bb54;
          std::operator<<(out,cVar5);
        }
        pp_Var4 = (_func_int **)((long)pp_Var4 + 1);
      } while( true );
    case NIL:
      pcVar3 = "()";
      break;
    case CELL:
      std::operator<<(out,"(");
      printCell(this,v,out);
      pcVar3 = ")";
      break;
    case SYMBOL:
      pcVar3 = (char *)v[1]._vptr_Value;
      break;
    case PRIM_PROC:
      pcVar3 = "#<primitive-procedure";
      break;
    case COMP_PROC:
      pcVar3 = "#<compound-procedure>";
      break;
    case INPUT_PORT:
      pcVar3 = "#<input-port>";
      break;
    case OUTPUT_PORT:
      pcVar3 = "#<output-port>";
      break;
    case EOF_OBJECT:
      pcVar3 = "#<eof>";
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cerr,"cannot write unknown type");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
  }
  else {
    std::operator<<(out,"#\\");
    cVar5 = (char)((ulong)v >> 2);
    if (cVar5 == '\t') {
      pcVar3 = "tab";
    }
    else {
      uVar1 = (uint)((ulong)v >> 2) & 0xff;
      if (uVar1 == 0x20) {
        pcVar3 = "space";
      }
      else {
        if (uVar1 != 10) {
          std::operator<<(out,cVar5);
          return;
        }
        pcVar3 = "newline";
      }
    }
  }
LAB_0010bb9a:
  std::operator<<(out,pcVar3);
  return;
LAB_0010bb54:
  pcVar3 = "\"";
  goto LAB_0010bb9a;
}

Assistant:

void Kvm::print(const Value *v, std::ostream& out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        char c = TK_CHR(v);
        out << "#\\";
        if (c == '\n')
        {
            out << "newline";
        } else if (c == ' ')
        {
            out << "space";
        } else if (c == '\t')
        {
            out << "tab";
        } else
        {
            out << c;
        }
    }
    else
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << "\"";
                {
                    const char *c = static_cast<const String *>(v)->value_;
                    while (*c)
                    {
                        switch (*c)
                        {
                            case '\n':
                                out << "\\n";
                                break;
                            case '\\':
                                out << "\\\\";
                                break;
                            case '"':
                                out << "\\\"";
                                break;
                            default:
                                out << *c;
                                break;
                        }
                        ++c;
                    }
                }
                out << "\"";
                break;
            case ValueType::SYMBOL:
                out << static_cast<const Symbol *>(v)->value_;
                break;
            case ValueType::NIL:
                out << "()";
                break;
            case ValueType::CELL:
                out << "(";
                printCell(v, out);
                out << ")";
                break;
            case ValueType::PRIM_PROC:
                out << "#<primitive-procedure";
                break;
            case ValueType::COMP_PROC:
                out << "#<compound-procedure>";
                break;
            case ValueType::INPUT_PORT:
                out << "#<input-port>";
                break;
            case ValueType::OUTPUT_PORT:
                out << "#<output-port>";
                break;
            case ValueType::EOF_OBJECT:
                out << "#<eof>";
                break;
            default:
                cerr << "cannot write unknown type" << endl;
                break;
        }
    }
}